

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O1

void test_all_maps<HashObject<256,32>>(int obj_size,int iters)

{
  int iVar1;
  pointer ppVar2;
  _Base_ptr p_Var3;
  ushort uVar4;
  uchar *puVar5;
  HashObject<256,_32> *pHVar6;
  iterator iVar7;
  iterator iVar8;
  nonempty_iterator ppVar9;
  uint uVar10;
  long lVar11;
  value_type *pvVar12;
  long lVar13;
  value_type *pvVar14;
  mapped_type *pmVar15;
  iterator iVar16;
  mapped_type *pmVar17;
  const_iterator cVar18;
  iterator iVar19;
  pointer psVar20;
  pointer ppVar21;
  pointer end_memory;
  size_t start_memory;
  size_t start_memory_00;
  pointer psVar22;
  size_t start_memory_01;
  size_type sVar23;
  size_t start_memory_02;
  size_t start_memory_03;
  size_t start_memory_04;
  pointer psVar24;
  _Base_ptr p_Var25;
  size_t start_memory_05;
  size_t start_memory_06;
  int iVar26;
  uint uVar27;
  size_type req_elements;
  _Base_ptr p_Var28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_HashObject<256,_32>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_HashObject<256,_32>,_int>_>_>
  pVar46;
  EasyUseHashMap<HashObject<256,_32>,_int,_HashFn> set_14;
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> set;
  undefined1 local_408 [8];
  const_iterator cStack_400;
  const_iterator local_3f8;
  const_iterator cStack_3f0;
  pointer local_3e8;
  const_iterator cStack_3e0;
  undefined1 local_3d8 [208];
  undefined1 local_308 [16];
  _Base_ptr local_2f8;
  _Base_ptr local_2f0;
  _Base_ptr local_2e8;
  size_t local_2e0;
  int local_1e8;
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  local_1e0 [10];
  size_type local_e8;
  size_type local_d8;
  pointer local_c8;
  sparse_hashtable_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  local_c0;
  iterator local_78;
  
  psVar24 = (pointer)(ulong)(uint)obj_size;
  iVar19._M_current = psVar24;
  printf("\n%s (%d byte objects, %d iterations):\n","SPARSE_HASH_MAP",0x100);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      pvVar12 = google::
                sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(key_type *)local_408);
      iVar26 = iVar26 + 1;
      pvVar12->second = iVar26;
    } while (obj_size != iVar26);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,
         (size_t)iVar19._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(local_1e0);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  req_elements = (size_type)obj_size;
  google::
  sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::resize((sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            *)local_308,req_elements);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      pvVar12 = google::
                sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(key_type *)local_408);
      iVar26 = iVar26 + 1;
      pvVar12->second = iVar26;
    } while (obj_size != iVar26);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,
         (size_t)iVar19._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(local_1e0);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      pvVar12 = google::
                sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(key_type *)local_408);
      iVar26 = iVar26 + 1;
      pvVar12->second = iVar26;
    } while (obj_size != iVar26);
  }
  iVar26 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      pvVar12 = google::
                sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(key_type *)local_408);
      iVar26 = iVar26 + 1;
      pvVar12->second = iVar26;
    } while (obj_size != iVar26);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,
         (size_t)iVar19._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(local_1e0);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_308,req_elements,(allocator_type *)local_408
            );
  auVar45 = _DAT_0013b020;
  if (0 < obj_size) {
    iVar19._M_current =
         (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
          *)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar5 = psVar24[-1].bitmap + 5;
    auVar29._8_4_ = (int)puVar5;
    auVar29._0_8_ = puVar5;
    auVar29._12_4_ = (int)((ulong)puVar5 >> 0x20);
    psVar20 = (pointer)0x0;
    auVar29 = auVar29 ^ _DAT_0013b020;
    auVar44 = _DAT_0013b010;
    do {
      auVar43 = auVar44 ^ auVar45;
      if ((bool)(~(auVar29._4_4_ < auVar43._4_4_ ||
                  auVar29._0_4_ < auVar43._0_4_ && auVar43._4_4_ == auVar29._4_4_) & 1)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar20 * 4) = (int)psVar20;
      }
      if (auVar43._12_4_ <= auVar29._12_4_ &&
          (auVar43._8_4_ <= auVar29._8_4_ || auVar43._12_4_ != auVar29._12_4_)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar20 * 4) =
             (int)psVar20 + 1;
      }
      psVar20 = (pointer)((long)&psVar20->group + 2);
      lVar11 = auVar44._8_8_;
      auVar44._0_8_ = auVar44._0_8_ + 2;
      auVar44._8_8_ = lVar11 + 2;
    } while (iVar19._M_current != psVar20);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_308);
  time_map_fetch<EasyUseSparseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_random");
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_308,req_elements,(allocator_type *)local_408
            );
  auVar45 = _DAT_0013b020;
  if (0 < obj_size) {
    iVar19._M_current =
         (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
          *)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar5 = psVar24[-1].bitmap + 5;
    auVar30._8_4_ = (int)puVar5;
    auVar30._0_8_ = puVar5;
    auVar30._12_4_ = (int)((ulong)puVar5 >> 0x20);
    psVar20 = (pointer)0x0;
    auVar30 = auVar30 ^ _DAT_0013b020;
    auVar43 = _DAT_0013b010;
    do {
      auVar44 = auVar43 ^ auVar45;
      if ((bool)(~(auVar30._4_4_ < auVar44._4_4_ ||
                  auVar30._0_4_ < auVar44._0_4_ && auVar44._4_4_ == auVar30._4_4_) & 1)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar20 * 4) = (int)psVar20;
      }
      if (auVar44._12_4_ <= auVar30._12_4_ &&
          (auVar44._8_4_ <= auVar30._8_4_ || auVar44._12_4_ != auVar30._12_4_)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar20 * 4) =
             (int)psVar20 + 1;
      }
      psVar20 = (pointer)((long)&psVar20->group + 2);
      lVar11 = auVar43._8_8_;
      auVar43._0_8_ = auVar43._0_8_ + 2;
      auVar43._8_8_ = lVar11 + 2;
    } while (iVar19._M_current != psVar20);
  }
  time_map_fetch<EasyUseSparseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_sequential");
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  uVar27 = 1;
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      google::
      sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
      ::find<HashObject<256,32>>
                (&local_78,
                 (sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                  *)local_308,(HashObject<256,_32> *)local_408);
      local_c0.pos.row_begin._M_current =
           local_1e0[0].
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_c0.pos.row_end._M_current =
           local_1e0[0].
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_c0.pos.row_current._M_current =
           local_1e0[0].
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_c0.pos.col_current = (pointer)0x0;
      local_c0.end.row_begin._M_current =
           local_1e0[0].
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_c0.end.row_end._M_current =
           local_1e0[0].
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_c0.end.row_current._M_current =
           local_1e0[0].
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_c0.end.col_current = (nonempty_iterator)0x0;
      local_c0.ht = (sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                     *)local_308;
      google::
      sparse_hashtable_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::advance_past_deleted(&local_c0);
      uVar10 = 1;
      iVar19._M_current = local_78.pos.row_begin._M_current;
      if (((local_78.pos.row_begin._M_current == local_c0.pos.row_begin._M_current) &&
          (iVar19._M_current = local_78.pos.row_end._M_current,
          local_78.pos.row_end._M_current == local_c0.pos.row_end._M_current)) &&
         (local_78.pos.row_current._M_current == local_c0.pos.row_current._M_current)) {
        if (local_78.pos.row_current._M_current == local_78.pos.row_end._M_current) {
          uVar10 = 0;
        }
        else {
          uVar10 = (uint)(local_78.pos.col_current != local_c0.pos.col_current);
          iVar19._M_current =
               (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                *)local_78.pos.col_current;
        }
      }
      uVar27 = uVar27 ^ uVar10;
      iVar26 = iVar26 + 1;
    } while (obj_size != iVar26);
  }
  lVar13 = std::chrono::_V2::steady_clock::now();
  srand(uVar27);
  report("map_fetch_empty",(double)(lVar13 - lVar11),obj_size,start_memory,(size_t)iVar19._M_current
        );
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(local_1e0);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      pvVar12 = google::
                sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(key_type *)local_408);
      iVar26 = iVar26 + 1;
      pvVar12->second = iVar26;
    } while (obj_size != iVar26);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      google::
      sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_308,(key_type *)local_408);
      iVar26 = iVar26 + 1;
    } while (obj_size != iVar26);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,
         (size_t)iVar19._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(local_1e0);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      pvVar12 = google::
                sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(key_type *)local_408);
      iVar1 = iVar26 + 1;
      pvVar12->second = iVar1;
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      google::
      sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_308,(key_type *)local_408);
      iVar26 = iVar1;
    } while (iVar1 != obj_size);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,
         (size_t)iVar19._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(local_1e0);
  EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      pvVar12 = google::
                sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::
                find_or_insert<google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::DefaultValue>
                          ((sparse_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(key_type *)local_408);
      iVar26 = iVar26 + 1;
      pvVar12->second = iVar26;
    } while (obj_size != iVar26);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  google::
  sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::begin(&local_78,
          (sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
           *)local_308);
  local_408 = (undefined1  [8])local_78.ht;
  cStack_400._M_current = local_78.pos.row_begin._M_current;
  local_3f8._M_current = local_78.pos.row_end._M_current;
  cStack_3f0._M_current = local_78.pos.row_current._M_current;
  local_3e8 = local_78.pos.col_current;
  cStack_3e0._M_current = local_78.end.row_begin._M_current;
  local_3d8[8] = (char)local_78.end.row_current._M_current;
  local_3d8[9] = local_78.end.row_current._M_current._1_1_;
  local_3d8[10] = local_78.end.row_current._M_current._2_1_;
  local_3d8[0xb] = local_78.end.row_current._M_current._3_1_;
  local_3d8[0xc] = local_78.end.row_current._M_current._4_1_;
  local_3d8[0xd] = local_78.end.row_current._M_current._5_1_;
  local_3d8[0xe] = local_78.end.row_current._M_current._6_1_;
  local_3d8[0xf] = local_78.end.row_current._M_current._7_1_;
  local_3d8._16_8_ = local_78.end.col_current;
  local_78.pos.row_begin._M_current =
       local_1e0[0].
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.pos.row_end._M_current =
       local_1e0[0].
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.pos.row_current._M_current =
       local_1e0[0].
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.pos.col_current = (pointer)0x0;
  local_78.end.row_begin._M_current =
       local_1e0[0].
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.end.row_end._M_current =
       local_1e0[0].
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.end.row_current._M_current =
       local_1e0[0].
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.end.col_current = (nonempty_iterator)0x0;
  local_78.ht = (sparse_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                 *)local_308;
  google::
  sparse_hashtable_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::advance_past_deleted(&local_78);
  ppVar9 = local_78.pos.col_current;
  iVar8._M_current = local_78.pos.row_current._M_current;
  iVar7._M_current = local_78.pos.row_end._M_current;
  iVar19._M_current = local_78.pos.row_begin._M_current;
  uVar27 = 1;
  while (((cStack_400._M_current != iVar19._M_current || (local_3f8._M_current != iVar7._M_current))
         || ((cStack_3f0._M_current != iVar8._M_current ||
             ((cStack_3f0._M_current != local_3f8._M_current && (local_3e8 != ppVar9))))))) {
    uVar27 = uVar27 ^ local_3e8->second;
    local_3e8 = local_3e8 + 1;
    uVar4 = ((cStack_3f0._M_current)->settings).num_buckets;
    cVar18._M_current = cStack_3f0._M_current;
    if (local_3e8 ==
        (pointer)((&(*(pointer *)&(cStack_3f0._M_current)->group)->first)[uVar4].buffer_ +
                 (ulong)uVar4 * 4 + -4)) {
      do {
        cVar18._M_current =
             (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
              *)((((pointer)cStack_3f0._M_current)->first).buffer_ + 0xc);
        if (cVar18._M_current == local_3f8._M_current) break;
        local_3e8 = *(pointer *)&((pointer)cVar18._M_current)->first;
        pHVar6 = &((pointer)cStack_3f0._M_current)->first;
        cStack_3f0._M_current = cVar18._M_current;
      } while (*(short *)(pHVar6->buffer_ + 0x14) == 0);
    }
    cStack_3f0._M_current = cVar18._M_current;
    google::
    sparse_hashtable_const_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::advance_past_deleted
              ((sparse_hashtable_const_iterator<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                *)local_408);
  }
  cVar18._M_current = cStack_3f0._M_current;
  lVar13 = std::chrono::_V2::steady_clock::now();
  srand(uVar27);
  report("map_iterate",(double)(lVar13 - lVar11),obj_size,start_memory_00,(size_t)cVar18._M_current)
  ;
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>_>_>
  ::~vector(local_1e0);
  iVar26 = 0;
  psVar20 = psVar24;
  printf("\n%s (%d byte objects, %d iterations):\n","DENSE_HASH_MAP",0x100);
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      pvVar14 = google::
                dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::find_or_insert<int,HashObject<256,32>>
                          ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(HashObject<256,_32> *)local_408);
      iVar26 = iVar26 + 1;
      pvVar14->second = iVar26;
    } while (obj_size != iVar26);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20);
  if (local_c8 != (pointer)0x0) {
    free(local_c8);
  }
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  google::
  dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::resize((dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            *)local_308,req_elements);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      pvVar14 = google::
                dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::find_or_insert<int,HashObject<256,32>>
                          ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(HashObject<256,_32> *)local_408);
      iVar26 = iVar26 + 1;
      pvVar14->second = iVar26;
    } while (obj_size != iVar26);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20)
  ;
  if (local_c8 != (pointer)0x0) {
    free(local_c8);
  }
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      pvVar14 = google::
                dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::find_or_insert<int,HashObject<256,32>>
                          ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(HashObject<256,_32> *)local_408);
      iVar26 = iVar26 + 1;
      pvVar14->second = iVar26;
    } while (obj_size != iVar26);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      pvVar14 = google::
                dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::find_or_insert<int,HashObject<256,32>>
                          ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(HashObject<256,_32> *)local_408);
      iVar26 = iVar26 + 1;
      pvVar14->second = iVar26;
    } while (obj_size != iVar26);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20);
  if (local_c8 != (pointer)0x0) {
    free(local_c8);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_308,req_elements,(allocator_type *)local_408
            );
  auVar45 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar20 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar5 = psVar24[-1].bitmap + 5;
    auVar31._8_4_ = (int)puVar5;
    auVar31._0_8_ = puVar5;
    auVar31._12_4_ = (int)((ulong)puVar5 >> 0x20);
    psVar22 = (pointer)0x0;
    auVar31 = auVar31 ^ _DAT_0013b020;
    auVar37 = _DAT_0013b010;
    do {
      auVar44 = auVar37 ^ auVar45;
      if ((bool)(~(auVar31._4_4_ < auVar44._4_4_ ||
                  auVar31._0_4_ < auVar44._0_4_ && auVar44._4_4_ == auVar31._4_4_) & 1)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar22 * 4) = (int)psVar22;
      }
      if (auVar44._12_4_ <= auVar31._12_4_ &&
          (auVar44._8_4_ <= auVar31._8_4_ || auVar44._12_4_ != auVar31._12_4_)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar22 * 4) =
             (int)psVar22 + 1;
      }
      psVar22 = (pointer)((long)&psVar22->group + 2);
      lVar11 = auVar37._8_8_;
      auVar37._0_8_ = auVar37._0_8_ + 2;
      auVar37._8_8_ = lVar11 + 2;
    } while (psVar20 != psVar22);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_308);
  time_map_fetch<EasyUseDenseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_random");
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_308,req_elements,(allocator_type *)local_408
            );
  auVar45 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar20 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar5 = psVar24[-1].bitmap + 5;
    auVar32._8_4_ = (int)puVar5;
    auVar32._0_8_ = puVar5;
    auVar32._12_4_ = (int)((ulong)puVar5 >> 0x20);
    psVar22 = (pointer)0x0;
    auVar32 = auVar32 ^ _DAT_0013b020;
    auVar38 = _DAT_0013b010;
    do {
      auVar44 = auVar38 ^ auVar45;
      if ((bool)(~(auVar32._4_4_ < auVar44._4_4_ ||
                  auVar32._0_4_ < auVar44._0_4_ && auVar44._4_4_ == auVar32._4_4_) & 1)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar22 * 4) = (int)psVar22;
      }
      if (auVar44._12_4_ <= auVar32._12_4_ &&
          (auVar44._8_4_ <= auVar32._8_4_ || auVar44._12_4_ != auVar32._12_4_)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar22 * 4) =
             (int)psVar22 + 1;
      }
      psVar22 = (pointer)((long)&psVar22->group + 2);
      lVar11 = auVar38._8_8_;
      auVar38._0_8_ = auVar38._0_8_ + 2;
      auVar38._8_8_ = lVar11 + 2;
    } while (psVar20 != psVar22);
  }
  time_map_fetch<EasyUseDenseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_sequential");
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  iVar26 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  uVar27 = 1;
  if (0 < obj_size) {
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      google::
      dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
      ::find<HashObject<256,32>>
                ((iterator *)&local_78,
                 (dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                  *)local_308,(HashObject<256,_32> *)local_408);
      psVar20 = (pointer)(ulong)((pointer)local_78.pos.row_begin._M_current != local_c8 + local_d8);
      uVar27 = uVar27 ^ (pointer)local_78.pos.row_begin._M_current != local_c8 + local_d8;
      iVar26 = iVar26 + 1;
    } while (obj_size != iVar26);
  }
  lVar13 = std::chrono::_V2::steady_clock::now();
  srand(uVar27);
  report("map_fetch_empty",(double)(lVar13 - lVar11),obj_size,start_memory_01,(size_t)psVar20);
  if (local_c8 != (pointer)0x0) {
    free(local_c8);
  }
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      pvVar14 = google::
                dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::find_or_insert<int,HashObject<256,32>>
                          ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(HashObject<256,_32> *)local_408);
      iVar26 = iVar26 + 1;
      pvVar14->second = iVar26;
    } while (obj_size != iVar26);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      google::
      dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_308,(key_type *)local_408);
      iVar26 = iVar26 + 1;
    } while (obj_size != iVar26);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20);
  if (local_c8 != (pointer)0x0) {
    free(local_c8);
  }
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      pvVar14 = google::
                dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::find_or_insert<int,HashObject<256,32>>
                          ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(HashObject<256,_32> *)local_408);
      iVar1 = iVar26 + 1;
      pvVar14->second = iVar1;
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      google::
      dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<256,_32>,_int>,_HashObject<256,_32>,_HashFn,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<256,_32>,_int,_HashFn,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>::SetKey,_std::equal_to<HashObject<256,_32>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_308,(HashObject<256,_32> *)local_408);
      iVar26 = iVar1;
    } while (iVar1 != obj_size);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20);
  if (local_c8 != (pointer)0x0) {
    free(local_c8);
  }
  EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<256,_32>,_int,_HashFn> *)local_308);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_408._0_4_ = iVar26;
      memset(local_408 + 4,iVar26,0xfc);
      pvVar14 = google::
                dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                ::find_or_insert<int,HashObject<256,32>>
                          ((dense_hashtable<std::pair<HashObject<256,32>const,int>,HashObject<256,32>,HashFn,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SelectKey,google::dense_hash_map<HashObject<256,32>,int,HashFn,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>::SetKey,std::equal_to<HashObject<256,32>>,google::libc_allocator_with_realloc<std::pair<HashObject<256,32>const,int>>>
                            *)local_308,(HashObject<256,_32> *)local_408);
      iVar26 = iVar26 + 1;
      pvVar14->second = iVar26;
    } while (obj_size != iVar26);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  sVar23 = local_d8 * 0x104;
  ppVar2 = local_c8 + local_d8;
  end_memory = local_c8;
  while (local_d8 != 0) {
    iVar26 = (end_memory->first).i_;
    if ((local_1e8 != iVar26) && (local_e8 == 0 || (int)local_2e8 != iVar26)) break;
    end_memory = end_memory + 1;
    sVar23 = sVar23 - 0x104;
    local_d8 = sVar23;
  }
  if (end_memory == ppVar2) {
    uVar27 = 1;
  }
  else {
    uVar27 = 1;
    ppVar21 = end_memory;
LAB_00124041:
    do {
      end_memory = end_memory + 1;
      if (end_memory != ppVar2) {
        iVar26 = (end_memory->first).i_;
        if ((local_1e8 == iVar26) || (local_e8 != 0 && (int)local_2e8 == iVar26)) goto LAB_00124041;
      }
      uVar27 = uVar27 ^ ppVar21->second;
      ppVar21 = end_memory;
    } while (end_memory != ppVar2);
  }
  lVar13 = std::chrono::_V2::steady_clock::now();
  srand(uVar27);
  report("map_iterate",(double)(lVar13 - lVar11),obj_size,start_memory_02,(size_t)end_memory);
  if (local_c8 != (pointer)0x0) {
    free(local_c8);
  }
  psVar20 = psVar24;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD HASH_MAP",0x100);
  local_408 = (undefined1  [8])local_3d8;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x1;
  local_3f8._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3e8 = (pointer)CONCAT44(local_3e8._4_4_,0x3f800000);
  cStack_3e0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3d8._0_8_ =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pmVar15 = std::__detail::
                _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_408,(key_type *)local_308);
      iVar26 = iVar26 + 1;
      *pmVar15 = iVar26;
    } while (obj_size != iVar26);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_408);
  local_408 = (undefined1  [8])local_3d8;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x1;
  local_3f8._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3e8 = (pointer)CONCAT44(local_3e8._4_4_,0x3f800000);
  cStack_3e0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3d8._0_8_ =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)local_408,req_elements);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pmVar15 = std::__detail::
                _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_408,(key_type *)local_308);
      iVar26 = iVar26 + 1;
      *pmVar15 = iVar26;
    } while (obj_size != iVar26);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20)
  ;
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_408);
  local_408 = (undefined1  [8])local_3d8;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x1;
  local_3f8._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3e8 = (pointer)CONCAT44(local_3e8._4_4_,0x3f800000);
  cStack_3e0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3d8._0_8_ =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pmVar15 = std::__detail::
                _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_408,(key_type *)local_308);
      iVar26 = iVar26 + 1;
      *pmVar15 = iVar26;
    } while (obj_size != iVar26);
  }
  iVar26 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    auVar45 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20);
    std::
    _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_408);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_308,req_elements,
               (allocator_type *)local_408);
  }
  else {
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pmVar15 = std::__detail::
                _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_408,(key_type *)local_308);
      iVar26 = iVar26 + 1;
      *pmVar15 = iVar26;
    } while (obj_size != iVar26);
    auVar45 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20);
    std::
    _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_408);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_308,req_elements,
               (allocator_type *)local_408);
    auVar45 = _DAT_0013b020;
    psVar20 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar5 = psVar24[-1].bitmap + 5;
    auVar33._8_4_ = (int)puVar5;
    auVar33._0_8_ = puVar5;
    auVar33._12_4_ = (int)((ulong)puVar5 >> 0x20);
    psVar22 = (pointer)0x0;
    auVar33 = auVar33 ^ _DAT_0013b020;
    auVar39 = _DAT_0013b010;
    do {
      auVar44 = auVar39 ^ auVar45;
      if ((bool)(~(auVar33._4_4_ < auVar44._4_4_ ||
                  auVar33._0_4_ < auVar44._0_4_ && auVar44._4_4_ == auVar33._4_4_) & 1)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar22 * 4) = (int)psVar22;
      }
      if (auVar44._12_4_ <= auVar33._12_4_ &&
          (auVar44._8_4_ <= auVar33._8_4_ || auVar44._12_4_ != auVar33._12_4_)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar22 * 4) =
             (int)psVar22 + 1;
      }
      psVar22 = (pointer)((long)&psVar22->group + 2);
      lVar11 = auVar39._8_8_;
      auVar39._0_8_ = auVar39._0_8_ + 2;
      auVar39._8_8_ = lVar11 + 2;
    } while (psVar20 != psVar22);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_308);
  time_map_fetch<EasyUseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_random");
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_308,req_elements,(allocator_type *)local_408
            );
  auVar45 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar20 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar5 = psVar24[-1].bitmap + 5;
    auVar34._8_4_ = (int)puVar5;
    auVar34._0_8_ = puVar5;
    auVar34._12_4_ = (int)((ulong)puVar5 >> 0x20);
    psVar22 = (pointer)0x0;
    auVar34 = auVar34 ^ _DAT_0013b020;
    auVar40 = _DAT_0013b010;
    do {
      auVar44 = auVar40 ^ auVar45;
      if ((bool)(~(auVar34._4_4_ < auVar44._4_4_ ||
                  auVar34._0_4_ < auVar44._0_4_ && auVar44._4_4_ == auVar34._4_4_) & 1)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar22 * 4) = (int)psVar22;
      }
      if (auVar44._12_4_ <= auVar34._12_4_ &&
          (auVar44._8_4_ <= auVar34._8_4_ || auVar44._12_4_ != auVar34._12_4_)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar22 * 4) =
             (int)psVar22 + 1;
      }
      psVar22 = (pointer)((long)&psVar22->group + 2);
      lVar11 = auVar40._8_8_;
      auVar40._0_8_ = auVar40._0_8_ + 2;
      auVar40._8_8_ = lVar11 + 2;
    } while (psVar20 != psVar22);
  }
  time_map_fetch<EasyUseHashMap<HashObject<256,32>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_sequential");
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  local_408 = (undefined1  [8])local_3d8;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x1;
  local_3f8._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3e8 = (pointer)CONCAT44(local_3e8._4_4_,0x3f800000);
  cStack_3e0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3d8._0_8_ =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  uVar27 = 1;
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      iVar16 = std::
               _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_408,(key_type *)local_308);
      psVar20 = (pointer)(ulong)(iVar16.
                                 super__Node_iterator_base<std::pair<const_HashObject<256,_32>,_int>,_true>
                                 ._M_cur != (__node_type *)0x0);
      uVar27 = uVar27 ^ iVar16.
                        super__Node_iterator_base<std::pair<const_HashObject<256,_32>,_int>,_true>.
                        _M_cur != (__node_type *)0x0;
      iVar26 = iVar26 + 1;
    } while (obj_size != iVar26);
  }
  lVar13 = std::chrono::_V2::steady_clock::now();
  srand(uVar27);
  report("map_fetch_empty",(double)(lVar13 - lVar11),obj_size,start_memory_03,(size_t)psVar20);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_408);
  local_408 = (undefined1  [8])local_3d8;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x1;
  local_3f8._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3e8 = (pointer)CONCAT44(local_3e8._4_4_,0x3f800000);
  cStack_3e0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3d8._0_8_ =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pmVar15 = std::__detail::
                _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_408,(key_type *)local_308);
      iVar26 = iVar26 + 1;
      *pmVar15 = iVar26;
    } while (obj_size != iVar26);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      std::
      _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_408,local_308);
      iVar26 = iVar26 + 1;
    } while (obj_size != iVar26);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_408);
  local_408 = (undefined1  [8])local_3d8;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x1;
  local_3f8._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3e8 = (pointer)CONCAT44(local_3e8._4_4_,0x3f800000);
  cStack_3e0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3d8._0_8_ =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pmVar15 = std::__detail::
                _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_408,(key_type *)local_308);
      iVar1 = iVar26 + 1;
      *pmVar15 = iVar1;
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      std::
      _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_408,(key_type *)local_308);
      iVar26 = iVar1;
    } while (iVar1 != obj_size);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_408);
  local_408 = (undefined1  [8])local_3d8;
  cStack_400._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x1;
  local_3f8._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3e8 = (pointer)CONCAT44(local_3e8._4_4_,0x3f800000);
  cStack_3e0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  local_3d8._0_8_ =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pmVar15 = std::__detail::
                _Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_408,(key_type *)local_308);
      iVar26 = iVar26 + 1;
      *pmVar15 = iVar26;
    } while (obj_size != iVar26);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  uVar27 = 1;
  for (cVar18._M_current = local_3f8._M_current;
      cVar18._M_current !=
      (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
       *)0x0; cVar18._M_current =
                   *(sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
                     **)&((pointer)cVar18._M_current)->first) {
    uVar27 = uVar27 ^ *(uint *)(((pointer)((long)cVar18._M_current + 0x104))->first).buffer_;
  }
  lVar13 = std::chrono::_V2::steady_clock::now();
  srand(uVar27);
  report("map_iterate",(double)(lVar13 - lVar11),obj_size,start_memory_04,(size_t)psVar20);
  std::
  _Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<256,_32>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_408);
  psVar20 = psVar24;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD MAP",0x100);
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)&cStack_400;
  cStack_400._M_current = cStack_400._M_current & 0xffffffff00000000;
  local_3f8._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3e0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_3e8 = (pointer)cStack_3f0._M_current;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pmVar17 = std::
                map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_408,(key_type *)local_308);
      iVar26 = iVar26 + 1;
      *pmVar17 = iVar26;
    } while (obj_size != iVar26);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20);
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_408);
  cStack_400._M_current = cStack_400._M_current & 0xffffffff00000000;
  local_3f8._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)&cStack_400;
  cStack_3e0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_3e8 = (pointer)cStack_3f0._M_current;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pmVar17 = std::
                map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_408,(key_type *)local_308);
      iVar26 = iVar26 + 1;
      *pmVar17 = iVar26;
    } while (obj_size != iVar26);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20)
  ;
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_408);
  cStack_400._M_current = cStack_400._M_current & 0xffffffff00000000;
  local_3f8._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)&cStack_400;
  cStack_3e0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_3e8 = (pointer)cStack_3f0._M_current;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pmVar17 = std::
                map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_408,(key_type *)local_308);
      iVar26 = iVar26 + 1;
      *pmVar17 = iVar26;
    } while (obj_size != iVar26);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    auVar45 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20);
    std::
    _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                 *)local_408);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_308,req_elements,
               (allocator_type *)local_408);
  }
  else {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pmVar17 = std::
                map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_408,(key_type *)local_308);
      iVar26 = iVar26 + 1;
      *pmVar17 = iVar26;
    } while (obj_size != iVar26);
    auVar45 = std::chrono::_V2::steady_clock::now();
    report("map_replace",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20);
    std::
    _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                 *)local_408);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_308,req_elements,
               (allocator_type *)local_408);
    auVar45 = _DAT_0013b020;
    if (0 < obj_size) {
      psVar20 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
      puVar5 = psVar24[-1].bitmap + 5;
      auVar35._8_4_ = (int)puVar5;
      auVar35._0_8_ = puVar5;
      auVar35._12_4_ = (int)((ulong)puVar5 >> 0x20);
      psVar22 = (pointer)0x0;
      auVar35 = auVar35 ^ _DAT_0013b020;
      auVar41 = _DAT_0013b010;
      do {
        auVar44 = auVar41 ^ auVar45;
        if ((bool)(~(auVar44._4_4_ == auVar35._4_4_ && auVar35._0_4_ < auVar44._0_4_ ||
                    auVar35._4_4_ < auVar44._4_4_) & 1)) {
          *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar22 * 4) = (int)psVar22;
        }
        if ((auVar44._12_4_ != auVar35._12_4_ || auVar44._8_4_ <= auVar35._8_4_) &&
            auVar44._12_4_ <= auVar35._12_4_) {
          *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar22 * 4) =
               (int)psVar22 + 1;
        }
        psVar22 = (pointer)((long)&psVar22->group + 2);
        lVar11 = auVar41._8_8_;
        auVar41._0_8_ = auVar41._0_8_ + 2;
        auVar41._8_8_ = lVar11 + 2;
      } while (psVar20 != psVar22);
    }
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_308);
  time_map_fetch<EasyUseMap<HashObject<256,32>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_random");
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_308,req_elements,(allocator_type *)local_408
            );
  auVar45 = _DAT_0013b020;
  if (0 < obj_size) {
    psVar20 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    puVar5 = psVar24[-1].bitmap + 5;
    auVar36._8_4_ = (int)puVar5;
    auVar36._0_8_ = puVar5;
    auVar36._12_4_ = (int)((ulong)puVar5 >> 0x20);
    psVar24 = (pointer)0x0;
    auVar36 = auVar36 ^ _DAT_0013b020;
    auVar42 = _DAT_0013b010;
    do {
      auVar44 = auVar42 ^ auVar45;
      if ((bool)(~(auVar44._4_4_ == auVar36._4_4_ && auVar36._0_4_ < auVar44._0_4_ ||
                  auVar36._4_4_ < auVar44._4_4_) & 1)) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + (long)psVar24 * 4) = (int)psVar24;
      }
      if ((auVar44._12_4_ != auVar36._12_4_ || auVar44._8_4_ <= auVar36._8_4_) &&
          auVar44._12_4_ <= auVar36._12_4_) {
        *(int *)(CONCAT44(local_308._4_4_,local_308._0_4_) + 4 + (long)psVar24 * 4) =
             (int)psVar24 + 1;
      }
      psVar24 = (pointer)((long)&psVar24->group + 2);
      lVar11 = auVar42._8_8_;
      auVar42._0_8_ = auVar42._0_8_ + 2;
      auVar42._8_8_ = lVar11 + 2;
    } while (psVar20 != psVar24);
  }
  time_map_fetch<EasyUseMap<HashObject<256,32>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_308,"map_fetch_sequential");
  if ((void *)CONCAT44(local_308._4_4_,local_308._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_308._4_4_,local_308._0_4_));
  }
  p_Var3 = (_Base_ptr)(local_308 + 8);
  local_308._8_4_ = _S_red;
  local_2f8 = (_Base_ptr)0x0;
  local_2e0 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_2f0 = p_Var3;
  local_2e8 = p_Var3;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  uVar27 = 1;
  if (0 < obj_size) {
    psVar20 = (pointer)0x0;
    do {
      iVar26 = (int)psVar20;
      p_Var25 = p_Var3;
      for (p_Var28 = local_2f8; p_Var28 != (_Base_ptr)0x0;
          p_Var28 = (&p_Var28->_M_left)[(int)p_Var28[1]._M_color < iVar26]) {
        if (iVar26 <= (int)p_Var28[1]._M_color) {
          p_Var25 = p_Var28;
        }
      }
      p_Var28 = p_Var3;
      if ((p_Var25 != p_Var3) && (p_Var28 = p_Var25, iVar26 < (int)p_Var25[1]._M_color)) {
        p_Var28 = p_Var3;
      }
      uVar27 = uVar27 ^ p_Var28 != p_Var3;
      psVar20 = (pointer)(ulong)(iVar26 + 1U);
    } while (iVar26 + 1U != obj_size);
  }
  lVar13 = std::chrono::_V2::steady_clock::now();
  srand(uVar27);
  report("map_fetch_empty",(double)(lVar13 - lVar11),obj_size,start_memory_05,(size_t)psVar20);
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_308);
  cStack_400._M_current = cStack_400._M_current & 0xffffffff00000000;
  local_3f8._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3e0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)&cStack_400;
  local_3e8 = (const_nonempty_iterator)&cStack_400;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pmVar17 = std::
                map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_408,(key_type *)local_308);
      iVar26 = iVar26 + 1;
      *pmVar17 = iVar26;
    } while (obj_size != iVar26);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pVar46 = std::
               _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_408,(key_type *)local_308);
      std::
      _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                      *)local_408,(_Base_ptr)pVar46.first._M_node,(_Base_ptr)pVar46.second._M_node);
      iVar26 = iVar26 + 1;
    } while (obj_size != iVar26);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20);
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_408);
  cStack_400._M_current = cStack_400._M_current & 0xffffffff00000000;
  local_3f8._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)&cStack_400;
  cStack_3e0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_3e8 = (pointer)cStack_3f0._M_current;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pmVar17 = std::
                map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_408,(key_type *)local_308);
      iVar1 = iVar26 + 1;
      *pmVar17 = iVar1;
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pVar46 = std::
               _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_408,(key_type *)local_308);
      std::
      _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                      *)local_408,(_Base_ptr)pVar46.first._M_node,(_Base_ptr)pVar46.second._M_node);
      iVar26 = iVar1;
    } while (iVar1 != obj_size);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar45._0_8_ - lVar11),obj_size,auVar45._8_8_,(size_t)psVar20);
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_408);
  cStack_400._M_current = cStack_400._M_current & 0xffffffff00000000;
  local_3f8._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  cStack_3e0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  cStack_3f0._M_current =
       (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
        *)&cStack_400;
  local_3e8 = (const_nonempty_iterator)&cStack_400;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    iVar26 = 0;
    do {
      local_308._0_4_ = iVar26;
      memset(local_308 + 4,iVar26,0xfc);
      pmVar17 = std::
                map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                ::operator[]((map<HashObject<256,_32>,_int,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
                              *)local_408,(key_type *)local_308);
      iVar26 = iVar26 + 1;
      *pmVar17 = iVar26;
    } while (obj_size != iVar26);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar11 = std::chrono::_V2::steady_clock::now();
  uVar27 = 1;
  for (cVar18._M_current = cStack_3f0._M_current;
      (const_nonempty_iterator)cVar18._M_current != (const_nonempty_iterator)&cStack_400;
      cVar18._M_current =
           (sparsegroup<std::pair<const_HashObject<256,_32>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<256,_32>,_int>_>_>
            *)std::_Rb_tree_increment(cVar18._M_current)) {
    uVar27 = uVar27 ^ *(uint *)((long)(((const_nonempty_iterator)((long)cVar18._M_current + 0x104))
                                      ->first).buffer_ + 0x18);
  }
  lVar13 = std::chrono::_V2::steady_clock::now();
  srand(uVar27);
  report("map_iterate",(double)(lVar13 - lVar11),obj_size,start_memory_06,(size_t)psVar20);
  std::
  _Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<256,_32>,_std::pair<const_HashObject<256,_32>,_int>,_std::_Select1st<std::pair<const_HashObject<256,_32>,_int>_>,_std::less<HashObject<256,_32>_>,_std::allocator<std::pair<const_HashObject<256,_32>,_int>_>_>
               *)local_408);
  return;
}

Assistant:

static void test_all_maps(int obj_size, int iters) {
  const bool stress_hash_function = obj_size <= 8;

  if (FLAGS_test_sparse_hash_map)
    measure_map<EasyUseSparseHashMap<ObjType, int, HashFn>,
                EasyUseSparseHashMap<ObjType*, int, HashFn>>(
        "SPARSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_dense_hash_map)
    measure_map<EasyUseDenseHashMap<ObjType, int, HashFn>,
                EasyUseDenseHashMap<ObjType*, int, HashFn>>(
        "DENSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_hash_map)
    measure_map<EasyUseHashMap<ObjType, int, HashFn>,
                EasyUseHashMap<ObjType*, int, HashFn>>(
        "STANDARD HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_map)
    measure_map<EasyUseMap<ObjType, int>, EasyUseMap<ObjType*, int>>(
        "STANDARD MAP", obj_size, iters, false);
}